

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr * __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
ReadNumericExpr_abi_cxx11_
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *this,
          char code,bool ignore_zero)

{
  byte in_CL;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *this_00;
  char in_DL;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *in_RSI;
  ExprPrinter *in_RDI;
  double dVar1;
  double value;
  int i;
  CallArgHandler args;
  int num_args;
  int func_index;
  int in_stack_00000284;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
  *in_stack_00000288;
  Expr *in_stack_ffffffffffffff68;
  NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  ArgHandler *this_01;
  ExprPrinter *pEVar2;
  BasicCStringRef<char> in_stack_ffffffffffffff98;
  CStringRef in_stack_ffffffffffffffa0;
  ArgHandler local_48 [36];
  int local_24;
  int local_1c;
  int local_18;
  byte local_12;
  
  local_12 = in_CL & 1;
  this_00 = (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)
            (ulong)((int)in_DL - 0x66);
  pEVar2 = in_RDI;
  switch(this_00) {
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)0x0:
    local_18 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
               ReadUInt(this_00,(uint)((ulong)in_RSI >> 0x20));
    local_1c = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                         ((BinaryReader<mp::internal::IdentityConverter> *)pEVar2);
    BinaryReaderBase::ReadTillEndOfLine(&in_RSI->reader_->super_BinaryReaderBase);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::BeginCall(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                (int)in_stack_ffffffffffffff68);
    for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
      this_01 = local_48;
      ReadSymbolicExpr_abi_cxx11_(this);
      NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::ArgHandler::AddArg(this_01,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string((string *)local_48);
    }
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::EndCall((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_RDI,in_RSI->handler_);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff98,"expected expression");
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)in_stack_ffffffffffffff98.data_,in_stack_ffffffffffffffa0);
    goto LAB_0015b224;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)0x6:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)0x8:
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)0xd:
    dVar1 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadConstant(this_00,(char)((ulong)in_RSI >> 0x38));
    if ((((local_12 & 1) == 0) || (dVar1 != 0.0)) || (NAN(dVar1))) {
      ExprPrinter::OnNumber_abi_cxx11_(in_RDI,(double)in_stack_ffffffffffffff70);
      return (NumericExpr *)pEVar2;
    }
LAB_0015b224:
    std::__cxx11::string::string((string *)in_RDI);
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)0x9:
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::ReadOpCode
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *
               )in_RDI);
    ReadNumericExpr_abi_cxx11_(in_stack_00000288,in_stack_00000284);
    pEVar2 = in_RDI;
    break;
  case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter> *)0x10:
    DoReadReference_abi_cxx11_(in_RSI);
    pEVar2 = in_RDI;
  }
  return (NumericExpr *)pEVar2;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}